

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void TestParseRootNotSingular(void)

{
  BubbleValue *pBVar1;
  FILE *pFVar2;
  ValueTypes VVar3;
  __tuple_element_t<0UL,_tuple<ParseResults,_BubbleValue_*>_> *p_Var4;
  __tuple_element_t<1UL,_tuple<ParseResults,_BubbleValue_*>_> *ppBVar5;
  char *pcVar6;
  BubbleJson local_48;
  BubbleJson local_38;
  BubbleJson local_28;
  undefined1 local_18 [8];
  tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> result;
  
  std::tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*>::tuple<true,_true>
            ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
  bubbleJson::BubbleJson::Parse(&local_28,(char *)&gm_BubbleJson);
  pcVar6 = (char *)&local_28;
  std::tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*>::operator=
            ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18,(type)pcVar6);
  g_TestCount = g_TestCount + 1;
  p_Var4 = std::get<0ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                     ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
  pFVar2 = _stderr;
  if (*p_Var4 == ParseResult_RootNotSingular) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    p_Var4 = std::get<0ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                       ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
    pcVar6 = "%s:%d: expect: %d actual: %d\n";
    fprintf(pFVar2,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",0x73
            ,3,(ulong)*p_Var4);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                      ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
  VVar3 = bubbleJson::BubbleValue::GetType(*ppBVar5);
  pFVar2 = _stderr;
  if (VVar3 == ValueType_Null) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                        ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
    VVar3 = bubbleJson::BubbleValue::GetType(*ppBVar5);
    pcVar6 = "%s:%d: expect: %d actual: %d\n";
    fprintf(pFVar2,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",0x73
            ,0,(ulong)VVar3);
    g_Result = 1;
  }
  ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                      ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
  pBVar1 = *ppBVar5;
  if (pBVar1 != (BubbleValue *)0x0) {
    bubbleJson::BubbleValue::~BubbleValue(pBVar1);
    bubbleJson::BubbleValue::operator_delete(pBVar1,pcVar6);
  }
  bubbleJson::BubbleJson::Parse(&local_38,(char *)&gm_BubbleJson);
  pcVar6 = (char *)&local_38;
  std::tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*>::operator=
            ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18,(type)pcVar6);
  g_TestCount = g_TestCount + 1;
  p_Var4 = std::get<0ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                     ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
  pFVar2 = _stderr;
  if (*p_Var4 == ParseResult_RootNotSingular) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    p_Var4 = std::get<0ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                       ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
    pcVar6 = "%s:%d: expect: %d actual: %d\n";
    fprintf(pFVar2,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",0x76
            ,3,(ulong)*p_Var4);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                      ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
  VVar3 = bubbleJson::BubbleValue::GetType(*ppBVar5);
  pFVar2 = _stderr;
  if (VVar3 == ValueType_Null) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                        ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
    VVar3 = bubbleJson::BubbleValue::GetType(*ppBVar5);
    pcVar6 = "%s:%d: expect: %d actual: %d\n";
    fprintf(pFVar2,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",0x76
            ,0,(ulong)VVar3);
    g_Result = 1;
  }
  ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                      ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
  pBVar1 = *ppBVar5;
  if (pBVar1 != (BubbleValue *)0x0) {
    bubbleJson::BubbleValue::~BubbleValue(pBVar1);
    bubbleJson::BubbleValue::operator_delete(pBVar1,pcVar6);
  }
  bubbleJson::BubbleJson::Parse(&local_48,(char *)&gm_BubbleJson);
  pcVar6 = (char *)&local_48;
  std::tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*>::operator=
            ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18,(type)pcVar6);
  g_TestCount = g_TestCount + 1;
  p_Var4 = std::get<0ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                     ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
  pFVar2 = _stderr;
  if (*p_Var4 == ParseResult_RootNotSingular) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    p_Var4 = std::get<0ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                       ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
    pcVar6 = "%s:%d: expect: %d actual: %d\n";
    fprintf(pFVar2,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",0x77
            ,3,(ulong)*p_Var4);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                      ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
  VVar3 = bubbleJson::BubbleValue::GetType(*ppBVar5);
  pFVar2 = _stderr;
  if (VVar3 == ValueType_Null) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                        ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
    VVar3 = bubbleJson::BubbleValue::GetType(*ppBVar5);
    pcVar6 = "%s:%d: expect: %d actual: %d\n";
    fprintf(pFVar2,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",0x77
            ,0,(ulong)VVar3);
    g_Result = 1;
  }
  ppBVar5 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                      ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)local_18);
  pBVar1 = *ppBVar5;
  if (pBVar1 != (BubbleValue *)0x0) {
    bubbleJson::BubbleValue::~BubbleValue(pBVar1);
    bubbleJson::BubbleValue::operator_delete(pBVar1,pcVar6);
  }
  return;
}

Assistant:

static void TestParseRootNotSingular()
{
    tuple<ParseResults, BubbleValue*> result;

    TEST_ERROR(ParseResult_RootNotSingular, "true a");

    //invalid number
    TEST_ERROR(ParseResult_RootNotSingular, "12a");
    TEST_ERROR(ParseResult_RootNotSingular, "0123");
}